

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3JoinType(Parse *pParse,Token *pA,Token *pB,Token *pC)

{
  uint N;
  Token *pTVar1;
  int iVar2;
  long lVar3;
  u8 *puVar4;
  char *pcVar5;
  ulong uVar6;
  bool bVar7;
  Token *apAll [3];
  uint local_6c;
  Token *local_48 [3];
  
  local_48[0] = pA;
  local_48[1] = pB;
  local_48[2] = pC;
  lVar3 = 0;
  local_6c = 0;
  do {
    pTVar1 = local_48[lVar3];
    if (pTVar1 == (Token *)0x0) break;
    N = pTVar1->n;
    puVar4 = &sqlite3JoinType::aKeyword[0].code;
    uVar6 = 0;
    do {
      if ((N == puVar4[-1]) &&
         (iVar2 = sqlite3_strnicmp(pTVar1->z,
                                   "naturaleftouterightfullinnercross" +
                                   ((anon_struct_3_3_0facdf6d *)(puVar4 + -2))->i,N), iVar2 == 0)) {
        local_6c = local_6c | *puVar4;
        bVar7 = 6 < uVar6;
        goto LAB_001492e7;
      }
      uVar6 = uVar6 + 1;
      puVar4 = puVar4 + 3;
    } while (uVar6 != 7);
    bVar7 = true;
LAB_001492e7:
    if (bVar7) {
      local_6c = local_6c | 0x40;
      break;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  if ((~local_6c & 0x21) == 0 || (local_6c & 0x40) != 0) {
    pcVar5 = " ";
    if (pC == (Token *)0x0) {
      pcVar5 = "";
    }
    sqlite3ErrorMsg(pParse,"unknown or unsupported join type: %T %T%s%T",pA,pB,pcVar5);
  }
  else {
    if ((local_6c & 0x18) == 8 || (local_6c & 0x20) == 0) {
      return local_6c;
    }
    sqlite3ErrorMsg(pParse,"RIGHT and FULL OUTER JOINs are not currently supported");
  }
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3JoinType(Parse *pParse, Token *pA, Token *pB, Token *pC){
  int jointype = 0;
  Token *apAll[3];
  Token *p;
                             /*   0123456789 123456789 123456789 123 */
  static const char zKeyText[] = "naturaleftouterightfullinnercross";
  static const struct {
    u8 i;        /* Beginning of keyword text in zKeyText[] */
    u8 nChar;    /* Length of the keyword in characters */
    u8 code;     /* Join type mask */
  } aKeyword[] = {
    /* natural */ { 0,  7, JT_NATURAL                },
    /* left    */ { 6,  4, JT_LEFT|JT_OUTER          },
    /* outer   */ { 10, 5, JT_OUTER                  },
    /* right   */ { 14, 5, JT_RIGHT|JT_OUTER         },
    /* full    */ { 19, 4, JT_LEFT|JT_RIGHT|JT_OUTER },
    /* inner   */ { 23, 5, JT_INNER                  },
    /* cross   */ { 28, 5, JT_INNER|JT_CROSS         },
  };
  int i, j;
  apAll[0] = pA;
  apAll[1] = pB;
  apAll[2] = pC;
  for(i=0; i<3 && apAll[i]; i++){
    p = apAll[i];
    for(j=0; j<ArraySize(aKeyword); j++){
      if( p->n==aKeyword[j].nChar 
          && sqlite3StrNICmp((char*)p->z, &zKeyText[aKeyword[j].i], p->n)==0 ){
        jointype |= aKeyword[j].code;
        break;
      }
    }
    testcase( j==0 || j==1 || j==2 || j==3 || j==4 || j==5 || j==6 );
    if( j>=ArraySize(aKeyword) ){
      jointype |= JT_ERROR;
      break;
    }
  }
  if(
     (jointype & (JT_INNER|JT_OUTER))==(JT_INNER|JT_OUTER) ||
     (jointype & JT_ERROR)!=0
  ){
    const char *zSp = " ";
    assert( pB!=0 );
    if( pC==0 ){ zSp++; }
    sqlite3ErrorMsg(pParse, "unknown or unsupported join type: "
       "%T %T%s%T", pA, pB, zSp, pC);
    jointype = JT_INNER;
  }else if( (jointype & JT_OUTER)!=0 
         && (jointype & (JT_LEFT|JT_RIGHT))!=JT_LEFT ){
    sqlite3ErrorMsg(pParse, 
      "RIGHT and FULL OUTER JOINs are not currently supported");
    jointype = JT_INNER;
  }
  return jointype;
}